

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

AMQP_VALUE amqpvalue_create_transfer(TRANSFER_HANDLE transfer)

{
  AMQP_VALUE pAVar1;
  
  if (transfer != (TRANSFER_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(transfer->composite_value);
    return pAVar1;
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_transfer(TRANSFER_HANDLE transfer)
{
    AMQP_VALUE result;

    if (transfer == NULL)
    {
        result = NULL;
    }
    else
    {
        TRANSFER_INSTANCE* transfer_instance = (TRANSFER_INSTANCE*)transfer;
        result = amqpvalue_clone(transfer_instance->composite_value);
    }

    return result;
}